

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SplayTree.h
# Opt level: O0

void __thiscall SplayTree<unsigned_long>::erase(SplayTree<unsigned_long> *this,unsigned_long value)

{
  Node *A;
  Node *local_28;
  Node *y;
  Node *z;
  unsigned_long value_local;
  SplayTree<unsigned_long> *this_local;
  
  z = (Node *)value;
  value_local = (unsigned_long)this;
  A = get(this,(unsigned_long *)&z);
  if (A != (Node *)0x0) {
    splay(this,A);
    if (A->left == (Node *)0x0) {
      replace(this,A,A->right);
    }
    else if (A->right == (Node *)0x0) {
      replace(this,A,A->left);
    }
    else {
      for (local_28 = A->right; local_28->left != (Node *)0x0; local_28 = local_28->left) {
      }
      if (local_28->parent != A) {
        replace(this,local_28,local_28->right);
        local_28->right = A->right;
        local_28->right->parent = local_28;
      }
      replace(this,A,local_28);
      local_28->left = A->left;
      local_28->left->parent = local_28;
    }
    A->right = (Node *)0x0;
    A->left = (Node *)0x0;
    if (A != (Node *)0x0) {
      Node::~Node(A);
      operator_delete(A,0x20);
    }
  }
  return;
}

Assistant:

void erase(T value) {
    Node *z = get(value);
    if (!z)
      return;

    splay(z);

    if (!z->left)
      replace(z, z->right);
    else if (!z->right)
      replace(z, z->left);
    else {
      Node *y = z->right;
      while (y->left)
        y = y->left;

      if (y->parent != z) {
        replace(y, y->right);
        y->right = z->right;
        y->right->parent = y;
      }
      replace(z, y);
      y->left = z->left;
      y->left->parent = y;
    }
    z->left = z->right = nullptr;
    delete z;
  }